

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

microseconds __thiscall
anon_unknown.dwarf_2e4871d::PeerManagerImpl::NextInvToInbounds
          (PeerManagerImpl *this,microseconds now,seconds average_interval)

{
  long lVar1;
  uint64_t uniform;
  long in_FS_OFFSET;
  double dVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_next_inv_to_inbounds)._M_i.__r < now.__r) {
    uniform = FastRandomContext::rand64(&this->m_rng);
    dVar2 = MakeExponentiallyDistributed(uniform);
    LOCK();
    (this->m_next_inv_to_inbounds)._M_i.__r = now.__r + (long)ROUND(dVar2 * 5000000.0 + 0.5);
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (microseconds)(this->m_next_inv_to_inbounds)._M_i.__r;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::microseconds PeerManagerImpl::NextInvToInbounds(std::chrono::microseconds now,
                                                             std::chrono::seconds average_interval)
{
    if (m_next_inv_to_inbounds.load() < now) {
        // If this function were called from multiple threads simultaneously
        // it would possible that both update the next send variable, and return a different result to their caller.
        // This is not possible in practice as only the net processing thread invokes this function.
        m_next_inv_to_inbounds = now + m_rng.rand_exp_duration(average_interval);
    }
    return m_next_inv_to_inbounds;
}